

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::LE_DeadReckoningParameter
          (LE_DeadReckoningParameter *this,DeadReckoningAlgorithm DRA,
          LE_Vector8_3 *LinearAcceleration,LE_Vector8_3 *AngularVelocity)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_DeadReckoningParameter_00226200;
  this->m_ui8DeadRecknoningAlgorithm = (KUINT8)DRA;
  (this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_Vector_00226258;
  (this->m_LinearAcceleration).m_X.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_LinearAcceleration).m_X.m_Val = (LinearAcceleration->m_X).m_Val;
  (this->m_LinearAcceleration).m_Y.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_LinearAcceleration).m_Y.m_Val = (LinearAcceleration->m_Y).m_Val;
  (this->m_LinearAcceleration).m_Z.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_LinearAcceleration).m_Z.m_Val = (LinearAcceleration->m_Z).m_Val;
  (this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_Vector_00226258;
  (this->m_AngularVelocity).m_X.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_AngularVelocity).m_X.m_Val = (AngularVelocity->m_X).m_Val;
  (this->m_AngularVelocity).m_Y.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_AngularVelocity).m_Y.m_Val = (AngularVelocity->m_Y).m_Val;
  (this->m_AngularVelocity).m_Z.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223510;
  (this->m_AngularVelocity).m_Z.m_Val = (AngularVelocity->m_Z).m_Val;
  return;
}

Assistant:

LE_DeadReckoningParameter::LE_DeadReckoningParameter( DeadReckoningAlgorithm DRA, const LE_Vector8_3 & LinearAcceleration,
        const LE_Vector8_3 & AngularVelocity ) :
    m_ui8DeadRecknoningAlgorithm( DRA ),
    m_LinearAcceleration( LinearAcceleration ),
    m_AngularVelocity( AngularVelocity )
{
}